

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subr0374.c
# Opt level: O3

LispPTR subr_k_trace(LispPTR *args)

{
  DLword DVar1;
  uint uVar2;
  DLword *pDVar3;
  
  if ((ushort)args[1] != 0) {
    pDVar3 = Lisp_world + *args;
    uVar2 = (ushort)args[1] + 1;
    do {
      DVar1 = *pDVar3;
      pDVar3 = (DLword *)((long)pDVar3 + 1);
      putc((int)(char)DVar1,_stderr);
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  putc(10,_stderr);
  return 0;
}

Assistant:

LispPTR subr_k_trace(LispPTR *args) {
  int len;
  char *base;

  len = 0xFFFF & args[1];
  base = (char *)NativeAligned2FromLAddr(args[0]);
  while (len-- > 0) putc(*base++, stderr);
  putc('\n', stderr);
  return (NIL);
}